

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O2

void print_doc(fdb_kvs_handle *db,char *kvs_name,uint64_t offset,dump_option *opt)

{
  anon_union_8_2_18a01fae_for_docio_object_3 aVar1;
  fdb_status fVar2;
  int64_t iVar3;
  void *buf;
  char *pcVar4;
  ushort uVar5;
  bool bVar6;
  docio_object local_e8;
  uint64_t offset_local;
  _fdb_key_cmp_info cmp_info;
  fdb_doc fdoc;
  
  local_e8.length.keylen = 0;
  local_e8.length.metalen = 0;
  local_e8.length.bodylen = 0;
  local_e8.length.bodylen_ondisk = 0;
  local_e8.length.flag = '\0';
  local_e8.length.checksum = '\0';
  local_e8.length.reserved = 0;
  local_e8._16_8_ = 0;
  local_e8.key = (void *)0x0;
  local_e8.field_3.seqnum = 0;
  local_e8.meta = (void *)0x0;
  local_e8.body = (void *)0x0;
  offset_local = offset;
  iVar3 = docio_read_doc(db->dhandle,offset,&local_e8,true);
  aVar1 = local_e8.field_3;
  if (0 < iVar3) {
    if ((local_e8.length._8_8_ & 0x1000000000) != 0) {
      offset_local = local_e8.field_3.doc_offset;
      iVar3 = docio_read_doc(db->dhandle,local_e8.field_3.doc_offset,&local_e8,true);
      offset = aVar1.doc_offset;
      if (iVar3 < 1) {
        return;
      }
    }
    bVar6 = db->kvs != (kvs_info *)0x0;
    uVar5 = local_e8.length.keylen - 8;
    if (!bVar6) {
      uVar5 = local_e8.length.keylen;
    }
    buf = (void *)((ulong)bVar6 * 8 + (long)local_e8.key);
    printf("Doc ID: ");
    print_buf(db,buf,(ulong)uVar5,opt->print_key_in_hex,opt->hex_align);
    if (kvs_name != (char *)0x0) {
      printf("    KV store name: %s\n",kvs_name);
    }
    if (local_e8.field_3.seqnum != 0xffffffffffffffff) {
      printf("    Sequence number: %lu\n");
    }
    printf("    Byte offset: %lu\n",offset);
    cmp_info.kvs_config.create_if_missing = (db->kvs_config).create_if_missing;
    cmp_info.kvs_config._1_7_ = *(undefined7 *)&(db->kvs_config).field_0x1;
    cmp_info.kvs_config.custom_cmp = (db->kvs_config).custom_cmp;
    cmp_info.kvs_config.custom_cmp_param = (db->kvs_config).custom_cmp_param;
    cmp_info.kvs = db->kvs;
    fdoc.key = local_e8.key;
    fdoc.keylen = local_e8.length._0_8_ & 0xffff;
    fVar2 = wal_find(&db->file->global_txn,db->file,&cmp_info,db->shandle,&fdoc,&offset_local);
    pcVar4 = "the main index";
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcVar4 = "WAL";
    }
    printf("    Indexed by %s\n",pcVar4);
    printf("    Length: %d (key), %d (metadata), %d (body)\n",(ulong)uVar5,
           (ulong)local_e8.length._0_8_ >> 0x10 & 0xffff,(ulong)local_e8.length._0_8_ >> 0x20);
    if ((local_e8.length._8_8_ & 0x200000000) != 0) {
      printf("    Compressed body size on disk: %d\n",local_e8.length._8_8_ & 0xffffffff);
    }
    if ((local_e8.length.flag & 4) == 0) {
      if ((local_e8.length.flag & 1) == 0) {
        pcVar4 = "    Status: normal";
      }
      else {
        pcVar4 = "    Status: normal (written during compaction)";
      }
      puts(pcVar4);
    }
    else {
      printf("    Status: deleted (timestamp: %u)\n",local_e8._16_8_ & 0xffffffff);
    }
    if (opt->no_meta == false) {
      printf("    Metadata: ");
      print_buf(db,local_e8.meta,(ulong)local_e8.length._0_8_ >> 0x10 & 0xffff,
                (bool)(opt->print_plain_meta ^ 1),opt->hex_align);
    }
    if (opt->no_body == false) {
      printf("    Body: ");
      print_buf(db,local_e8.body,(ulong)local_e8.length._0_8_ >> 0x20,opt->print_body_in_hex,
                opt->hex_align);
    }
    putchar(10);
    free(local_e8.key);
    free(local_e8.meta);
    free(local_e8.body);
  }
  return;
}

Assistant:

void print_doc(fdb_kvs_handle *db,
               char *kvs_name,
               uint64_t offset,
               struct dump_option *opt)
{
    uint8_t is_wal_entry;
    int64_t _offset;
    void *key;
    keylen_t keylen;
    fdb_status wr;
    fdb_doc fdoc;
    struct docio_object doc;
    struct _fdb_key_cmp_info cmp_info;

    memset(&doc, 0, sizeof(struct docio_object));

    _offset = docio_read_doc(db->dhandle, offset, &doc, true);
    if (_offset <= 0) {
        return;
    }
    if (doc.length.flag & DOCIO_TXN_COMMITTED) {
        offset = doc.doc_offset;
        _offset = docio_read_doc(db->dhandle, offset, &doc, true);
        if (_offset <= 0) {
            return;
        }
    }

    if (db->kvs) {
        key = (uint8_t*)doc.key + sizeof(fdb_kvs_id_t);
        keylen = doc.length.keylen - sizeof(fdb_kvs_id_t);
    } else {
        key = doc.key;
        keylen = doc.length.keylen;
    }

    printf("Doc ID: ");
    print_buf(db, key, keylen,
              opt->print_key_in_hex, opt->hex_align);
    if (kvs_name) {
        printf("    KV store name: %s\n", kvs_name);
    }
    if (doc.seqnum != SEQNUM_NOT_USED) {
        printf("    Sequence number: %" _F64 "\n", doc.seqnum);
    }
    printf("    Byte offset: %" _F64 "\n", offset);

    cmp_info.kvs_config = db->kvs_config;
    cmp_info.kvs = db->kvs;
    fdoc.key = doc.key;
    fdoc.keylen = doc.length.keylen;
    wr = wal_find(&db->file->global_txn, db->file,
                  &cmp_info, db->shandle, &fdoc, &offset);
    is_wal_entry = (wr == FDB_RESULT_SUCCESS)?(1):(0);
    printf("    Indexed by %s\n", (is_wal_entry)?("WAL"):("the main index"));
    printf("    Length: %d (key), %d (metadata), %d (body)\n",
           keylen, doc.length.metalen, doc.length.bodylen);
    if (doc.length.flag & DOCIO_COMPRESSED) {
        printf("    Compressed body size on disk: %d\n",
               doc.length.bodylen_ondisk);
    }
    if (doc.length.flag & DOCIO_DELETED) {
        printf("    Status: deleted (timestamp: %u)\n", doc.timestamp);
    } else {
        if (doc.length.flag & DOCIO_COMPACT) {
            printf("    Status: normal (written during compaction)\n");
        } else {
            printf("    Status: normal\n");
        }
    }
    if (!opt->no_meta) {
        printf("    Metadata: ");
        print_buf(db, doc.meta, doc.length.metalen,
                  !opt->print_plain_meta, opt->hex_align);
    }
    if (!opt->no_body) {
        printf("    Body: ");
        print_buf(db, doc.body, doc.length.bodylen,
                  opt->print_body_in_hex, opt->hex_align);
    }
    printf("\n");

    free(doc.key);
    free(doc.meta);
    free(doc.body);
}